

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O0

SUNErrCode SUNAdaptController_Write_Soderlind(SUNAdaptController C,FILE *fptr)

{
  FILE *in_RSI;
  long *in_RDI;
  SUNContext_conflict sunctx_local_scope_;
  
  fprintf(in_RSI,"Soderlind SUNAdaptController module:\n");
  fprintf(in_RSI,"  k1 = %.15g\n",*(undefined8 *)*in_RDI);
  fprintf(in_RSI,"  k2 = %.15g\n",*(undefined8 *)(*in_RDI + 8));
  fprintf(in_RSI,"  k3 = %.15g\n",*(undefined8 *)(*in_RDI + 0x10));
  fprintf(in_RSI,"  k4 = %.15g\n",*(undefined8 *)(*in_RDI + 0x18));
  fprintf(in_RSI,"  k5 = %.15g\n",*(undefined8 *)(*in_RDI + 0x20));
  fprintf(in_RSI,"  bias factor = %.15g\n",*(undefined8 *)(*in_RDI + 0x28));
  fprintf(in_RSI,"  previous error = %.15g\n",*(undefined8 *)(*in_RDI + 0x30));
  fprintf(in_RSI,"  previous-previous error = %.15g\n",*(undefined8 *)(*in_RDI + 0x38));
  fprintf(in_RSI,"  previous step = %.15g\n",*(undefined8 *)(*in_RDI + 0x40));
  fprintf(in_RSI,"  previous-previous step = %.15g\n",*(undefined8 *)(*in_RDI + 0x48));
  fprintf(in_RSI,"  firststeps = %i\n",(ulong)*(uint *)(*in_RDI + 0x50));
  fprintf(in_RSI,"  historysize = %i\n",(ulong)*(uint *)(*in_RDI + 0x54));
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_Write_Soderlind(SUNAdaptController C, FILE* fptr)
{
  SUNFunctionBegin(C->sunctx);
  SUNAssert(fptr, SUN_ERR_ARG_CORRUPT);
  fprintf(fptr, "Soderlind SUNAdaptController module:\n");
  fprintf(fptr, "  k1 = " SUN_FORMAT_G "\n", SODERLIND_K1(C));
  fprintf(fptr, "  k2 = " SUN_FORMAT_G "\n", SODERLIND_K2(C));
  fprintf(fptr, "  k3 = " SUN_FORMAT_G "\n", SODERLIND_K3(C));
  fprintf(fptr, "  k4 = " SUN_FORMAT_G "\n", SODERLIND_K4(C));
  fprintf(fptr, "  k5 = " SUN_FORMAT_G "\n", SODERLIND_K5(C));
  fprintf(fptr, "  bias factor = " SUN_FORMAT_G "\n", SODERLIND_BIAS(C));
  fprintf(fptr, "  previous error = " SUN_FORMAT_G "\n", SODERLIND_EP(C));
  fprintf(fptr, "  previous-previous error = " SUN_FORMAT_G "\n",
          SODERLIND_EPP(C));
  fprintf(fptr, "  previous step = " SUN_FORMAT_G "\n", SODERLIND_HP(C));
  fprintf(fptr, "  previous-previous step = " SUN_FORMAT_G "\n",
          SODERLIND_HPP(C));
  fprintf(fptr, "  firststeps = %i\n", SODERLIND_FIRSTSTEPS(C));
  fprintf(fptr, "  historysize = %i\n", SODERLIND_HISTORYSIZE(C));
  return SUN_SUCCESS;
}